

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  FieldDescriptor *this_00;
  bool bVar1;
  uint32_t number;
  OneofDescriptor *pOVar2;
  string_view text;
  
  WriteUInt32ToUtf16CharSequence(this->descriptor_->number_,output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  this_00 = this->descriptor_;
  bVar1 = FieldDescriptor::has_presence(this_00);
  if (bVar1) {
    if ((this_00->field_0x3 & 1) != 0) {
      if ((this_00->field_0x1 & 0x10) == 0) {
        pOVar2 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar2 = (this_00->scope_).containing_oneof;
        if (pOVar2 == (OneofDescriptor *)0x0) {
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
      }
      if (pOVar2 == (OneofDescriptor *)0x0) {
LAB_0034a6cd:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb63);
      }
      if ((pOVar2->field_count_ == 1) && ((pOVar2->fields_->field_0x1 & 2) != 0)) {
        GenerateFieldInfo();
        goto LAB_0034a6cd;
      }
      if ((this_00->field_0x3 & 1) != 0) goto LAB_0034a69d;
    }
    WriteUInt32ToUtf16CharSequence(this->messageBitIndex_,output);
  }
LAB_0034a69d:
  text._M_str = "\"$name$_\",\n";
  text._M_len = 0xb;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (HasHasbit(descriptor_)) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
}